

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall ACSStringPool::WriteStrings(ACSStringPool *this,FILE *file,DWORD id)

{
  PoolEntry *pPVar1;
  long lVar2;
  long lVar3;
  int32_t poolsize;
  FPNGChunkArchive arc;
  uint local_32c;
  FPNGChunkArchive local_328;
  
  local_32c = (this->Pool).Count;
  if (local_32c != 0) {
    FPNGChunkArchive::FPNGChunkArchive(&local_328,file,id);
    FArchive::operator<<(&local_328.super_FArchive,&local_32c);
    if (0 < (int)local_32c) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        pPVar1 = (this->Pool).Array;
        if (*(int *)((long)&pPVar1->Next + lVar2) != -2) {
          FArchive::WriteCount(&local_328.super_FArchive,(DWORD)lVar3);
          FArchive::WriteString
                    (&local_328.super_FArchive,(FString *)((long)&(pPVar1->Str).Chars + lVar2));
          FArchive::WriteCount
                    (&local_328.super_FArchive,*(DWORD *)((long)&pPVar1->LockCount + lVar2));
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x18;
      } while (lVar3 < (int)local_32c);
    }
    FArchive::WriteCount(&local_328.super_FArchive,0xffffffff);
    FPNGChunkArchive::~FPNGChunkArchive(&local_328);
  }
  return;
}

Assistant:

int ACSStringPool::AddString(FString &str)
{
	unsigned int h = SuperFastHash(str.GetChars(), str.Len());
	unsigned int bucketnum = h % NUM_BUCKETS;
	int i = FindString(str, str.Len(), h, bucketnum);
	if (i >= 0)
	{
		return i | STRPOOL_LIBRARYID_OR;
	}
	return InsertString(str, h, bucketnum);
}